

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

void output_proc(Proc *proc,TextBuffer *mb)

{
  BasicBlock *pBVar1;
  int i;
  long lVar2;
  char *str;
  
  raviX_buffer_add_fstring(mb,"define Proc%%%d\n",(ulong)proc->id);
  for (lVar2 = 0; lVar2 < (int)proc->node_count; lVar2 = lVar2 + 1) {
    pBVar1 = proc->nodes[lVar2];
    raviX_buffer_add_fstring(mb,"L%d",(ulong)pBVar1->index);
    str = "\n";
    if (pBVar1->index == 1) {
      str = " (exit)\n";
    }
    if (pBVar1->index == 0) {
      str = " (entry)\n";
    }
    raviX_buffer_add_string(mb,str);
    output_instructions(pBVar1->insns,mb,"\t","\n");
  }
  return;
}

Assistant:

static void output_proc(Proc *proc, TextBuffer *mb)
{
	BasicBlock *bb;
	raviX_buffer_add_fstring(mb, "define Proc%%%d\n", proc->id);
	for (int i = 0; i < (int)proc->node_count; i++) {
		bb = proc->nodes[i];
		output_basic_block(proc, bb, mb);
	}
}